

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fak_algorithm.c
# Opt level: O1

void fak_a(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  solver_state_a s;
  int local_120 [4];
  long local_110;
  long local_108;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_b8;
  
  setup_simple_state_a(&two_dof_robot_a,local_120);
  if (0 < local_120[0]) {
    lVar2 = 0;
    lVar3 = 0;
    lVar4 = 0;
    do {
      lVar5 = _two_dof_robot_c + lVar2 + 0x20;
      kca_fpk(lVar5,local_110 + lVar4);
      ga_pose_compose(local_110 + lVar4,_two_dof_robot_c + lVar2,local_108 + lVar4);
      kca_fvk(lVar5,local_f8 + lVar4);
      ga_twist_tf_ref_to_tgt(local_108 + lVar4,local_e8 + lVar4,local_f0 + lVar4);
      lVar1 = lVar4 + 0x20;
      ga_twist_accumulate(local_f0 + lVar4,local_f8 + lVar4,local_e8 + lVar1);
      kca_fak(lVar5,local_e0 + lVar4);
      kca_inertial_acceleration(lVar5,local_e8 + lVar1,local_d8 + lVar4);
      ga_acc_twist_add(local_e0 + lVar4,local_d8 + lVar4,local_d0 + lVar4);
      ga_acc_twist_tf_ref_to_tgt(local_108 + lVar4,local_b8 + lVar4,local_c8 + lVar4);
      ga_acc_twist_accumulate(local_c8 + lVar4,lVar4 + local_d0,local_b8 + lVar1);
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x60;
      lVar4 = lVar1;
    } while (lVar3 < local_120[0]);
  }
  ga_acc_twist_log((long)local_120[0] * 0x20 + local_b8);
  return;
}

Assistant:

void fak_a()
{
    struct kca_kinematic_chain *kc = &two_dof_robot_a;
    struct solver_state_a s;

    setup_simple_state_a(kc, &s);


    for (int i = 1; i < s.nbody + 1; i++) {
        struct kca_joint *joint = &kc->segment[i - 1].joint;

        // Position
        //

        // X_{J,i}
        kca_fpk(joint, &s.x_jnt[i - 1]);

        // i^X_{i-1} = X_{J,i} X_{T,i}
        ga_pose_compose(&s.x_jnt[i - 1], &kc->segment[i - 1].joint_attachment, &s.x_rel[i - 1]);


        // Velocity
        //

        // Xd_{J,i} = S qd
        kca_fvk(joint, &s.xd_jnt[i - 1]);

        // Xd_{i-1}' = i^X_{i-1} Xd_{i-1}
        ga_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xd[i - 1], &s.xd_tf[i - 1]);

        // Xd_i = Xd_{i-1}' + Xd_{J,i}
        ga_twist_accumulate(&s.xd_tf[i - 1], &s.xd_jnt[i - 1], &s.xd[i]);


        // Acceleration
        //

        // Xdd_{J,i} = S_i qdd_i
        kca_fak(joint, &s.xdd_jnt[i - 1]);

        // Xdd_{bias,i} = S_i qdd_i + Sd_i qd_i + Xd_i x S_i qd_i
        kca_inertial_acceleration(joint, &s.xd[i], &s.xdd_bias[i - 1]);

        // Xdd_{J,i}' = Xdd_{J,i} + Xdd_{bias,i}
        ga_acc_twist_add(&s.xdd_jnt[i - 1], &s.xdd_bias[i - 1], &s.xdd_net[i - 1]);

        // Xdd_{i-1}' = i^X_{i-1} Xdd_{i-1}
        ga_acc_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xdd[i - 1], &s.xdd_tf[i - 1]);

        // Xdd_i = Xdd_{i-1}' + Xdd_{J,i}'
        ga_acc_twist_accumulate(&s.xdd_tf[i - 1], &s.xdd_net[i - 1], &s.xdd[i]);
    }

    ga_acc_twist_log(&s.xdd[s.nbody]);
}